

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_noderel.cc
# Opt level: O1

RC __thiscall QL_NodeRel::SetUpNode(QL_NodeRel *this,int *attrs,int attrlistSize)

{
  int *__dest;
  
  (this->super_QL_Node).attrsInRecSize = attrlistSize;
  __dest = (int *)malloc((long)attrlistSize * 4);
  (this->super_QL_Node).attrsInRec = __dest;
  __dest[0] = 0;
  __dest[1] = 0;
  if (0 < attrlistSize) {
    memcpy(__dest,attrs,(ulong)(uint)attrlistSize << 2);
  }
  (this->super_QL_Node).listsInitialized = true;
  return 0;
}

Assistant:

RC QL_NodeRel::SetUpNode(int *attrs, int attrlistSize){
  RC rc = 0;
  attrsInRecSize = attrlistSize;
  attrsInRec = (int*)malloc(attrlistSize*sizeof(int));
  memset((void *)attrsInRec, 0, sizeof(attrsInRec));
  for(int i = 0; i < attrlistSize; i++){
    attrsInRec[i] = attrs[i];
  }
  listsInitialized = true;

  return (rc);
}